

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::UnionInPlace
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  uint *puVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  CharSetInner *this_00;
  undefined4 extraout_var;
  uint i;
  uint index;
  size_t sVar8;
  undefined **ppuVar9;
  
  sVar8 = (other->rep).compact.countPlusOne;
  if (sVar8 - 1 < 5) {
    index = 0;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (4 < sVar8 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar3) goto LAB_00e5bc59;
        *puVar6 = 0;
        sVar8 = (other->rep).compact.countPlusOne;
      }
      if ((int)sVar8 - 1U <= index) {
        return;
      }
      uVar4 = GetCompactCharU(other,index);
      SetRange(this,allocator,(Char)uVar4,(Char)uVar4);
      index = index + 1;
      sVar8 = (other->rep).compact.countPlusOne;
    } while( true );
  }
  if ((((this->rep).compact.countPlusOne - 1 < 5) &&
      (SwitchRepresentations(this,allocator), (this->rep).compact.countPlusOne - 1 < 5)) ||
     ((other->rep).compact.countPlusOne - 1 < 5)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x48e,"(!IsCompact() && !other.IsCompact())",
                       "!IsCompact() && !other.IsCompact()");
    if (!bVar3) {
LAB_00e5bc59:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  lVar7 = 2;
  do {
    puVar1 = (uint *)((long)&this->rep + lVar7 * 4);
    *puVar1 = *puVar1 | *(uint *)((long)&other->rep + lVar7 * 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  ppuVar9 = (undefined **)(other->rep).compact.countPlusOne;
  if (ppuVar9 != (undefined **)0x0) {
    this_00 = (CharSetInner *)(this->rep).full.root;
    if (ppuVar9 == &CharSetFull::Instance) {
      ppuVar9 = &CharSetFull::Instance;
      if (this_00 != (CharSetInner *)0x0) {
        (**(this_00->super_CharSetNode)._vptr_CharSetNode)(this_00,allocator);
      }
    }
    else {
      if (this_00 == (CharSetInner *)0x0) {
        this_00 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x364470);
        CharSetInner::CharSetInner(this_00);
        (this->rep).full.root = (CharSetNode *)this_00;
        ppuVar9 = (undefined **)(other->rep).compact.countPlusOne;
      }
      iVar5 = (*(this_00->super_CharSetNode)._vptr_CharSetNode[4])(this_00,allocator,2,ppuVar9);
      ppuVar9 = (undefined **)CONCAT44(extraout_var,iVar5);
    }
    (this->rep).compact.countPlusOne = (size_t)ppuVar9;
  }
  return;
}

Assistant:

void CharSet<char16>::UnionInPlace(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                Set(allocator, other.GetCompactChar(i));
            }
            return;
        }

        if (IsCompact())
            SwitchRepresentations(allocator);

        Assert(!IsCompact() && !other.IsCompact());

        rep.full.direct.UnionInPlace(other.rep.full.direct);

        if (other.rep.full.root != nullptr)
        {
            if (other.rep.full.root == CharSetFull::TheFullNode)
            {
                if (rep.full.root != nullptr)
                    rep.full.root->FreeSelf(allocator);
                rep.full.root = CharSetFull::TheFullNode;
            }
            else
            {
                if (rep.full.root == nullptr)
                    rep.full.root = Anew(allocator, CharSetInner);
                rep.full.root = rep.full.root->UnionInPlace(allocator, CharSetNode::levels - 1, other.rep.full.root);
            }
        }
    }